

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O3

Result<std::pair<unsigned_int,_wasm::Name>_> * __thiscall
wasm::IRBuilder::getExtraOutputLocalAndLabel
          (Result<std::pair<unsigned_int,_wasm::Name>_> *__return_storage_ptr__,IRBuilder *this,
          Index label,size_t extraArity)

{
  undefined8 *puVar1;
  long lVar2;
  __index_type *p_Var3;
  long lVar4;
  undefined8 uVar5;
  char *pcVar6;
  void *pvVar7;
  Type TVar8;
  pointer pNVar9;
  undefined1 *puVar10;
  Iterator __first;
  Name NVar11;
  Iterator __last;
  undefined1 local_e8 [8];
  Result<wasm::IRBuilder::ScopeCtx_*> scope;
  Type labelType;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  Type local_98;
  Type extraType;
  undefined1 local_88 [8];
  Result<wasm::Name> name;
  undefined1 auStack_58 [8];
  Result<wasm::IRBuilder::ScopeCtx_*> _val;
  
  getScope((Result<wasm::IRBuilder::ScopeCtx_*> *)local_e8,this,label);
  std::__detail::__variant::_Copy_ctor_base<false,_wasm::IRBuilder::ScopeCtx_*,_wasm::Err>::
  _Copy_ctor_base((_Copy_ctor_base<false,_wasm::IRBuilder::ScopeCtx_*,_wasm::Err> *)auStack_58,
                  (_Copy_ctor_base<false,_wasm::IRBuilder::ScopeCtx_*,_wasm::Err> *)local_e8);
  if (_val.val.super__Variant_base<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
      super__Move_assign_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
      super__Copy_assign_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
      super__Move_ctor_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
      super__Copy_ctor_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
      super__Variant_storage_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>._M_u._24_1_ == '\x01') {
    puVar10 = (undefined1 *)
              ((long)&name.val.super__Variant_base<wasm::Name,_wasm::Err>.
                      super__Move_assign_alias<wasm::Name,_wasm::Err>.
                      super__Copy_assign_alias<wasm::Name,_wasm::Err>.
                      super__Move_ctor_alias<wasm::Name,_wasm::Err>.
                      super__Copy_ctor_alias<wasm::Name,_wasm::Err> + 8);
    local_88 = (undefined1  [8])puVar10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_88,CONCAT44(auStack_58._4_4_,auStack_58._0_4_),
               CONCAT44(_val.val.super__Variant_base<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                        super__Move_assign_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                        super__Copy_assign_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                        super__Move_ctor_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                        super__Variant_storage_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>._M_u.
                        _4_4_,_val.val.super__Variant_base<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                              super__Move_assign_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                              super__Copy_assign_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                              super__Move_ctor_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                              super__Copy_ctor_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                              super__Variant_storage_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                              _M_u._0_4_) + CONCAT44(auStack_58._4_4_,auStack_58._0_4_));
    puVar1 = (undefined8 *)
             ((long)&(__return_storage_ptr__->val).
                     super__Variant_base<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
                     super__Move_assign_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
                     super__Copy_assign_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
                     super__Move_ctor_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
                     super__Copy_ctor_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
                     super__Variant_storage_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err> +
             0x10);
    *(undefined8 **)
     &(__return_storage_ptr__->val).
      super__Variant_base<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
      super__Move_assign_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
      super__Copy_assign_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
      super__Move_ctor_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
      super__Copy_ctor_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
      super__Variant_storage_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err> = puVar1;
    if (local_88 == (undefined1  [8])puVar10) {
      *puVar1 = name.val.super__Variant_base<wasm::Name,_wasm::Err>.
                super__Move_assign_alias<wasm::Name,_wasm::Err>.
                super__Copy_assign_alias<wasm::Name,_wasm::Err>.
                super__Move_ctor_alias<wasm::Name,_wasm::Err>.
                super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
                super__Variant_storage_alias<wasm::Name,_wasm::Err>._M_u._M_first._M_storage.
                super_IString.str._M_str;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).
               super__Variant_base<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
               super__Move_assign_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
               super__Copy_assign_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
               super__Move_ctor_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
               super__Copy_ctor_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
               super__Variant_storage_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err> + 0x18)
           = name.val.super__Variant_base<wasm::Name,_wasm::Err>.
             super__Move_assign_alias<wasm::Name,_wasm::Err>.
             super__Copy_assign_alias<wasm::Name,_wasm::Err>.
             super__Move_ctor_alias<wasm::Name,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
             super__Variant_storage_alias<wasm::Name,_wasm::Err>._M_u._16_8_;
    }
    else {
      *(undefined1 (*) [8])
       &(__return_storage_ptr__->val).
        super__Variant_base<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
        super__Move_assign_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
        super__Copy_assign_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
        super__Move_ctor_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
        super__Copy_ctor_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
        super__Variant_storage_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err> = local_88;
      *(char **)((long)&(__return_storage_ptr__->val).
                        super__Variant_base<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
                        super__Move_assign_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
                        super__Copy_assign_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
                        super__Move_ctor_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
                        super__Copy_ctor_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
                        super__Variant_storage_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>
                + 0x10) =
           name.val.super__Variant_base<wasm::Name,_wasm::Err>.
           super__Move_assign_alias<wasm::Name,_wasm::Err>.
           super__Copy_assign_alias<wasm::Name,_wasm::Err>.
           super__Move_ctor_alias<wasm::Name,_wasm::Err>.
           super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
           super__Variant_storage_alias<wasm::Name,_wasm::Err>._M_u._M_first._M_storage.
           super_IString.str._M_str;
    }
    *(size_t *)
     ((long)&(__return_storage_ptr__->val).
             super__Variant_base<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
             super__Move_assign_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
             super__Copy_assign_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
             super__Move_ctor_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
             super__Copy_ctor_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
             super__Variant_storage_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err> + 8) =
         name.val.super__Variant_base<wasm::Name,_wasm::Err>.
         super__Move_assign_alias<wasm::Name,_wasm::Err>.
         super__Copy_assign_alias<wasm::Name,_wasm::Err>.
         super__Move_ctor_alias<wasm::Name,_wasm::Err>.super__Copy_ctor_alias<wasm::Name,_wasm::Err>
         .super__Variant_storage_alias<wasm::Name,_wasm::Err>._M_u._M_first._M_storage.super_IString
         .str._M_len;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).
             super__Variant_base<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
             super__Move_assign_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
             super__Copy_assign_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
             super__Move_ctor_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
             super__Copy_ctor_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
             super__Variant_storage_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err> + 0x20) =
         '\x01';
    std::__detail::__variant::_Variant_storage<false,_wasm::IRBuilder::ScopeCtx_*,_wasm::Err>::
    ~_Variant_storage((_Variant_storage<false,_wasm::IRBuilder::ScopeCtx_*,_wasm::Err> *)auStack_58)
    ;
  }
  else {
    name.val.super__Variant_base<wasm::Name,_wasm::Err>.
    super__Move_assign_alias<wasm::Name,_wasm::Err>.super__Copy_assign_alias<wasm::Name,_wasm::Err>.
    super__Move_ctor_alias<wasm::Name,_wasm::Err>.super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
    super__Variant_storage_alias<wasm::Name,_wasm::Err>._36_4_ = label;
    std::__detail::__variant::_Variant_storage<false,_wasm::IRBuilder::ScopeCtx_*,_wasm::Err>::
    ~_Variant_storage((_Variant_storage<false,_wasm::IRBuilder::ScopeCtx_*,_wasm::Err> *)auStack_58)
    ;
    extraType.id = (long)local_e8 + 0x70;
    pNVar9 = (((vector<wasm::Name,_std::allocator<wasm::Name>_> *)((long)local_e8 + 0x70))->
             super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)((long)*(pointer *)((long)local_e8 + 0x78) - (long)pNVar9 >> 4) < extraArity) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)((long)local_e8 + 0x58),
                 extraArity);
      std::vector<wasm::Name,_std::allocator<wasm::Name>_>::resize
                ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)extraType.id,extraArity);
      pNVar9 = (((vector<wasm::Name,_std::allocator<wasm::Name>_> *)extraType.id)->
               super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>)._M_impl.
               super__Vector_impl_data._M_start;
    }
    lVar2 = extraArity - 1;
    if (pNVar9[lVar2].super_IString.str._M_str == (char *)0x0) {
      if ((*(__index_type *)((long)local_e8 + 0x18) == '\x05') && (*(long *)local_e8 != 0)) {
        scope.val.super__Variant_base<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
        super__Move_assign_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
        super__Copy_assign_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
        super__Move_ctor_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
        super__Copy_ctor_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
        super__Variant_storage_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>._32_8_ =
             ((Type *)((long)local_e8 + 0x48))->id;
      }
      else {
        scope.val.super__Variant_base<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
        super__Move_assign_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
        super__Copy_assign_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
        super__Move_ctor_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
        super__Copy_ctor_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
        super__Variant_storage_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>._32_8_ =
             ScopeCtx::getResultType((ScopeCtx *)local_e8);
      }
      p_Var3 = (__index_type *)
               ((long)&scope.val.super__Variant_base<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                       super__Move_assign_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                       super__Copy_assign_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                       super__Move_ctor_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err> + 0x20);
      __first.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index = 0;
      __first.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
           (Type *)p_Var3;
      __last.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index = extraArity;
      __last.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
           (Type *)p_Var3;
      std::vector<wasm::Type,std::allocator<wasm::Type>>::vector<wasm::Type::Iterator,void>
                ((vector<wasm::Type,std::allocator<wasm::Type>> *)auStack_58,__first,__last,
                 (allocator_type *)local_88);
      wasm::Type::Type(&local_98,(Tuple *)auStack_58);
      pvVar7 = (void *)CONCAT44(auStack_58._4_4_,auStack_58._0_4_);
      if (pvVar7 != (void *)0x0) {
        operator_delete(pvVar7,CONCAT44(_val.val.
                                        super__Variant_base<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                                        super__Move_assign_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>
                                        .
                                        super__Copy_assign_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>
                                        .
                                        super__Move_ctor_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>
                                        .
                                        super__Copy_ctor_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>
                                        .
                                        super__Variant_storage_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>
                                        ._M_u._12_4_,
                                        _val.val.
                                        super__Variant_base<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                                        super__Move_assign_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>
                                        .
                                        super__Copy_assign_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>
                                        .
                                        super__Move_ctor_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>
                                        .
                                        super__Copy_ctor_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>
                                        .
                                        super__Variant_storage_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>
                                        ._M_u._8_4_) - (long)pvVar7);
      }
      addScratchLocal((Result<unsigned_int> *)auStack_58,this,local_98);
      std::__detail::__variant::_Copy_ctor_base<false,_unsigned_int,_wasm::Err>::_Copy_ctor_base
                ((_Copy_ctor_base<false,_unsigned_int,_wasm::Err> *)local_88,
                 (_Copy_ctor_base<false,_unsigned_int,_wasm::Err> *)auStack_58);
      if (name.val.super__Variant_base<wasm::Name,_wasm::Err>.
          super__Move_assign_alias<wasm::Name,_wasm::Err>.
          super__Copy_assign_alias<wasm::Name,_wasm::Err>.
          super__Move_ctor_alias<wasm::Name,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
          super__Variant_storage_alias<wasm::Name,_wasm::Err>._M_u._24_1_ == '\x01') {
        labelType.id = (uintptr_t)&local_a8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&labelType,local_88,
                   (undefined1 *)
                   (name.val.super__Variant_base<wasm::Name,_wasm::Err>.
                    super__Move_assign_alias<wasm::Name,_wasm::Err>.
                    super__Copy_assign_alias<wasm::Name,_wasm::Err>.
                    super__Move_ctor_alias<wasm::Name,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
                    super__Variant_storage_alias<wasm::Name,_wasm::Err>._M_u._M_first._M_storage.
                    super_IString.str._M_len + (long)local_88));
        puVar1 = (undefined8 *)
                 ((long)&(__return_storage_ptr__->val).
                         super__Variant_base<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
                         super__Move_assign_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
                         super__Copy_assign_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
                         super__Move_ctor_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
                         super__Copy_ctor_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
                         super__Variant_storage_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>
                 + 0x10);
        *(undefined8 **)
         &(__return_storage_ptr__->val).
          super__Variant_base<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
          super__Move_assign_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
          super__Copy_assign_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
          super__Move_ctor_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
          super__Copy_ctor_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
          super__Variant_storage_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err> = puVar1;
        if ((undefined8 *)labelType.id == &local_a8) {
          *puVar1 = local_a8;
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->val).
                   super__Variant_base<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
                   super__Move_assign_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
                   super__Copy_assign_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
                   super__Move_ctor_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
                   super__Copy_ctor_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
                   super__Variant_storage_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err> +
           0x18) = uStack_a0;
        }
        else {
          *(uintptr_t *)
           &(__return_storage_ptr__->val).
            super__Variant_base<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
            super__Move_assign_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
            super__Copy_assign_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
            super__Move_ctor_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
            super__Copy_ctor_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
            super__Variant_storage_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err> =
               labelType.id;
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->val).
                   super__Variant_base<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
                   super__Move_assign_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
                   super__Copy_assign_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
                   super__Move_ctor_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
                   super__Copy_ctor_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
                   super__Variant_storage_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err> +
           0x10) = local_a8;
        }
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).
                 super__Variant_base<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
                 super__Move_assign_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
                 super__Copy_assign_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
                 super__Move_ctor_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
                 super__Copy_ctor_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
                 super__Variant_storage_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err> + 8) =
             local_b0;
        *(__index_type *)
         ((long)&(__return_storage_ptr__->val).
                 super__Variant_base<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
                 super__Move_assign_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
                 super__Copy_assign_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
                 super__Move_ctor_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
                 super__Copy_ctor_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
                 super__Variant_storage_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err> + 0x20
         ) = '\x01';
        std::__detail::__variant::_Variant_storage<false,_unsigned_int,_wasm::Err>::
        ~_Variant_storage((_Variant_storage<false,_unsigned_int,_wasm::Err> *)local_88);
        std::__detail::__variant::_Variant_storage<false,_unsigned_int,_wasm::Err>::
        ~_Variant_storage((_Variant_storage<false,_unsigned_int,_wasm::Err> *)auStack_58);
        goto LAB_00c85432;
      }
      std::__detail::__variant::_Variant_storage<false,_unsigned_int,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_unsigned_int,_wasm::Err> *)local_88);
      getLabelName((Result<wasm::Name> *)local_88,this,
                   name.val.super__Variant_base<wasm::Name,_wasm::Err>.
                   super__Move_assign_alias<wasm::Name,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Name,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Name,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Name,_wasm::Err>._36_4_,false);
      (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)((long)local_e8 + 0x58))->
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_start[extraArity - 1] = auStack_58._0_4_;
      puVar10 = local_88;
      if (name.val.super__Variant_base<wasm::Name,_wasm::Err>.
          super__Move_assign_alias<wasm::Name,_wasm::Err>.
          super__Copy_assign_alias<wasm::Name,_wasm::Err>.
          super__Move_ctor_alias<wasm::Name,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
          super__Variant_storage_alias<wasm::Name,_wasm::Err>._M_u._24_1_ != '\0') {
        puVar10 = (undefined1 *)0x0;
      }
      NVar11.super_IString.str._M_str = *(char **)(puVar10 + 8);
      NVar11.super_IString.str._M_len = (size_t)local_88;
      NVar11 = makeFresh(this,NVar11,0);
      TVar8 = extraType;
      lVar4 = *(long *)extraType.id;
      *(size_t *)(lVar4 + lVar2 * 0x10) = NVar11.super_IString.str._M_len;
      *(char **)(lVar4 + 8 + lVar2 * 0x10) = NVar11.super_IString.str._M_str;
      std::__detail::__variant::_Variant_storage<false,_wasm::Name,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_wasm::Name,_wasm::Err> *)local_88);
      std::__detail::__variant::_Variant_storage<false,_unsigned_int,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_unsigned_int,_wasm::Err> *)auStack_58);
      pNVar9 = *(pointer *)TVar8.id;
    }
    uVar5 = pNVar9[lVar2].super_IString.str._M_len;
    pcVar6 = pNVar9[lVar2].super_IString.str._M_str;
    auStack_58._4_4_ = (undefined4)uVar5;
    _val.val.super__Variant_base<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
    super__Move_assign_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
    super__Copy_assign_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
    super__Move_ctor_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
    super__Copy_ctor_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
    super__Variant_storage_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>._M_u._0_4_ =
         (undefined4)((ulong)uVar5 >> 0x20);
    _val.val.super__Variant_base<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
    super__Move_assign_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
    super__Copy_assign_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
    super__Move_ctor_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
    super__Copy_ctor_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
    super__Variant_storage_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>._M_u._4_4_ =
         SUB84(pcVar6,0);
    _val.val.super__Variant_base<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
    super__Move_assign_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
    super__Copy_assign_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
    super__Move_ctor_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
    super__Copy_ctor_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
    super__Variant_storage_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>._M_u._8_4_ =
         (undefined4)((ulong)pcVar6 >> 0x20);
    *(uint *)&(__return_storage_ptr__->val).
              super__Variant_base<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
              super__Move_assign_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
              super__Copy_assign_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
              super__Move_ctor_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
              super__Copy_ctor_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
              super__Variant_storage_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err> =
         (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)((long)local_e8 + 0x58))->
         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
         super__Vector_impl_data._M_start[extraArity - 1];
    *(ulong *)((long)&(__return_storage_ptr__->val).
                      super__Variant_base<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
                      super__Move_assign_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
                      super__Copy_assign_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
                      super__Move_ctor_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
                      super__Copy_ctor_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
                      super__Variant_storage_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err> +
              4) = CONCAT44(auStack_58._4_4_,auStack_58._0_4_);
    *(ulong *)((long)&(__return_storage_ptr__->val).
                      super__Variant_base<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
                      super__Move_assign_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
                      super__Copy_assign_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
                      super__Move_ctor_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
                      super__Copy_ctor_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
                      super__Variant_storage_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err> +
              0xc) =
         CONCAT44(_val.val.super__Variant_base<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                  super__Move_assign_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                  super__Copy_assign_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                  super__Move_ctor_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                  super__Variant_storage_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>._M_u._4_4_,
                  _val.val.super__Variant_base<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                  super__Move_assign_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                  super__Copy_assign_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                  super__Move_ctor_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
                  super__Variant_storage_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>._M_u._0_4_);
    *(undefined4 *)
     ((long)&(__return_storage_ptr__->val).
             super__Variant_base<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
             super__Move_assign_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
             super__Copy_assign_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
             super__Move_ctor_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
             super__Copy_ctor_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
             super__Variant_storage_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err> + 0x14) =
         _val.val.super__Variant_base<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
         super__Move_assign_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
         super__Copy_assign_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
         super__Move_ctor_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
         super__Copy_ctor_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>.
         super__Variant_storage_alias<wasm::IRBuilder::ScopeCtx_*,_wasm::Err>._M_u._8_4_;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).
             super__Variant_base<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
             super__Move_assign_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
             super__Copy_assign_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
             super__Move_ctor_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
             super__Copy_ctor_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err>.
             super__Variant_storage_alias<std::pair<unsigned_int,_wasm::Name>,_wasm::Err> + 0x20) =
         '\0';
  }
LAB_00c85432:
  std::__detail::__variant::_Variant_storage<false,_wasm::IRBuilder::ScopeCtx_*,_wasm::Err>::
  ~_Variant_storage((_Variant_storage<false,_wasm::IRBuilder::ScopeCtx_*,_wasm::Err> *)local_e8);
  return __return_storage_ptr__;
}

Assistant:

Result<std::pair<Index, Name>>
IRBuilder::getExtraOutputLocalAndLabel(Index label, size_t extraArity) {
  auto scope = getScope(label);
  CHECK_ERR(scope);
  auto& s = **scope;
  auto i = extraArity - 1;
  if (s.outputLabels.size() < extraArity) {
    s.outputLocals.resize(extraArity);
    s.outputLabels.resize(extraArity);
  }
  if (!s.outputLabels[i]) {
    auto labelType = s.getLabelType();
    auto it = labelType.begin();
    Type extraType = Tuple(it, it + extraArity);
    auto local = addScratchLocal(extraType);
    CHECK_ERR(local);
    auto name = getLabelName(label);
    s.outputLocals[i] = *local;
    s.outputLabels[i] = makeFresh(*name);
  }

  return std::make_pair(s.outputLocals[i], s.outputLabels[i]);
}